

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_file_system.cpp
# Opt level: O1

void __thiscall
duckdb::LocalFileSystem::Read
          (LocalFileSystem *this,FileHandle *handle,void *buffer,int64_t nr_bytes,idx_t location)

{
  int __fd;
  pointer pcVar1;
  bool bVar2;
  ssize_t sVar3;
  IOException *pIVar4;
  int *piVar5;
  char *params_1;
  size_t sVar6;
  undefined1 local_12b;
  undefined1 local_12a;
  undefined1 local_129;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  string local_a8;
  string local_88;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  
  if (0 < nr_bytes) {
    __fd = *(int *)&handle[1]._vptr_FileHandle;
    do {
      sVar3 = pread(__fd,buffer,nr_bytes,location);
      if (sVar3 == 0) {
        pIVar4 = (IOException *)__cxa_allocate_exception(0x10);
        local_e8.first._M_dataplus._M_p = (pointer)&local_e8.first.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e8,
                   "Could not read enough bytes from file \"%s\": attempted to read %llu bytes from location %llu"
                   ,"");
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        pcVar1 = (handle->path)._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_128,pcVar1,pcVar1 + (handle->path)._M_string_length);
        IOException::IOException<std::__cxx11::string,long,unsigned_long>
                  (pIVar4,&local_e8.first,&local_128,nr_bytes,location);
        __cxa_throw(pIVar4,&IOException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (sVar3 == -1) {
        pIVar4 = (IOException *)__cxa_allocate_exception(0x10);
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Could not read from file \"%s\": %s","");
        piVar5 = __errno_location();
        std::__cxx11::to_string(&local_88,*piVar5);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&local_e8,(char (*) [6])"errno",&local_88);
        ::std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_Hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&local_68,&local_e8,&local_a8,0,&local_129,&local_12a,&local_12b);
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        pcVar1 = (handle->path)._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_108,pcVar1,pcVar1 + (handle->path)._M_string_length);
        params_1 = strerror(*piVar5);
        IOException::IOException<std::__cxx11::string,char*>
                  (pIVar4,&local_a8,&local_68,&local_108,params_1);
        __cxa_throw(pIVar4,&IOException::typeinfo,::std::runtime_error::~runtime_error);
      }
      buffer = (void *)((long)buffer + sVar3);
      location = location + sVar3;
      sVar6 = nr_bytes - sVar3;
      bVar2 = sVar3 <= nr_bytes;
      nr_bytes = sVar6;
    } while (sVar6 != 0 && bVar2);
  }
  return;
}

Assistant:

void LocalFileSystem::Read(FileHandle &handle, void *buffer, int64_t nr_bytes, idx_t location) {
	int fd = handle.Cast<UnixFileHandle>().fd;
	auto read_buffer = char_ptr_cast(buffer);
	while (nr_bytes > 0) {
		int64_t bytes_read =
		    pread(fd, read_buffer, UnsafeNumericCast<size_t>(nr_bytes), UnsafeNumericCast<off_t>(location));
		if (bytes_read == -1) {
			throw IOException("Could not read from file \"%s\": %s", {{"errno", std::to_string(errno)}}, handle.path,
			                  strerror(errno));
		}
		if (bytes_read == 0) {
			throw IOException(
			    "Could not read enough bytes from file \"%s\": attempted to read %llu bytes from location %llu",
			    handle.path, nr_bytes, location);
		}
		read_buffer += bytes_read;
		nr_bytes -= bytes_read;
		location += UnsafeNumericCast<idx_t>(bytes_read);
	}
}